

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O0

void Fxu_PairCanonicize2(Fxu_Cube **ppCube1,Fxu_Cube **ppCube2)

{
  Fxu_Cube *pFVar1;
  Fxu_Cube *pCubeTemp;
  Fxu_Cube **ppCube2_local;
  Fxu_Cube **ppCube1_local;
  
  if ((*ppCube2)->iCube < (*ppCube1)->iCube) {
    pFVar1 = *ppCube1;
    *ppCube1 = *ppCube2;
    *ppCube2 = pFVar1;
  }
  return;
}

Assistant:

void Fxu_PairCanonicize2( Fxu_Cube ** ppCube1, Fxu_Cube ** ppCube2 )
{
    Fxu_Cube * pCubeTemp;
    // canonicize the pair by ordering the cubes
    if ( (*ppCube1)->iCube > (*ppCube2)->iCube )
    { // swap the cubes
        pCubeTemp = *ppCube1;
        *ppCube1  = *ppCube2;
        *ppCube2  = pCubeTemp;
    }
}